

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_same_normal(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  REF_GEOM ref_geom_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_INT local_12c;
  REF_INT local_128;
  int local_124;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL supported;
  REF_STATUS status;
  REF_DBL dot;
  REF_DBL n1 [3];
  double local_d8;
  REF_DBL n0 [3];
  REF_INT local_b8 [2];
  REF_INT nodes [27];
  REF_INT node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  ref_cell_00 = ref_grid->cell[3];
  *allowed = 1;
  if ((node1 < 0) || (ref_cell_00->ref_adj->nnode <= node1)) {
    local_124 = -1;
  }
  else {
    local_124 = ref_cell_00->ref_adj->first[node1];
  }
  node = local_124;
  if (local_124 == -1) {
    local_128 = -1;
  }
  else {
    local_128 = ref_cell_00->ref_adj->item[local_124].ref;
  }
  nodes[0x1a] = local_128;
  do {
    if (node == -1) {
      return 0;
    }
    if (((node0 != ref_cell_00->c2n[ref_cell_00->size_per * nodes[0x1a]]) &&
        (node0 != ref_cell_00->c2n[ref_cell_00->size_per * nodes[0x1a] + 1])) &&
       (node0 != ref_cell_00->c2n[ref_cell_00->size_per * nodes[0x1a] + 2])) {
      uVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],local_b8);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x298,"ref_collapse_edge_same_normal",(ulong)uVar1,"nodes");
        return uVar1;
      }
      uVar1 = ref_geom_tri_supported(ref_geom_00,local_b8,&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x29a,"ref_collapse_edge_same_normal",(ulong)uVar1,"tri support");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 == 0) {
        uVar1 = ref_node_tri_normal(ref_node_00,local_b8,&local_d8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x29d,"ref_collapse_edge_same_normal",(ulong)uVar1,"orig normal");
          return uVar1;
        }
        uVar1 = ref_math_normalize(&local_d8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x29e,"ref_collapse_edge_same_normal",(ulong)uVar1,
                 "original triangle has zero area");
          return uVar1;
        }
        for (nodes[0x19] = 0; nodes[0x19] < ref_cell_00->node_per; nodes[0x19] = nodes[0x19] + 1) {
          if (node1 == local_b8[nodes[0x19]]) {
            local_b8[nodes[0x19]] = node0;
          }
        }
        uVar1 = ref_node_tri_normal(ref_node_00,local_b8,&dot);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x2a4,"ref_collapse_edge_same_normal",(ulong)uVar1,"new normal");
          return uVar1;
        }
        uVar1 = ref_math_normalize(&dot);
        if (uVar1 == 4) {
          *allowed = 0;
          return 0;
        }
        if (uVar1 != 0) {
          ref_private_macro_code_rss = uVar1;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x2aa,"ref_collapse_edge_same_normal",(ulong)uVar1,"new normal length");
          return uVar1;
        }
        _supported = n0[1] * n1[1] + local_d8 * dot + n0[0] * n1[0];
        if (_supported < ref_node_00->same_normal_tol) {
          *allowed = 0;
          return 0;
        }
        ref_private_macro_code_rss = 0;
      }
    }
    node = ref_cell_00->ref_adj->item[node].next;
    if (node == -1) {
      local_12c = -1;
    }
    else {
      local_12c = ref_cell_00->ref_adj->item[node].ref;
    }
    nodes[0x1a] = local_12c;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_same_normal(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL n0[3], n1[3];
  REF_DBL dot;
  REF_STATUS status;
  REF_BOOL supported;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    /* a triangle with node0 and node1 will be removed */
    if (node0 == ref_cell_c2n(ref_cell, 0, cell) ||
        node0 == ref_cell_c2n(ref_cell, 1, cell) ||
        node0 == ref_cell_c2n(ref_cell, 2, cell))
      continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (supported) continue; /* geom support, checked by normdev */

    RSS(ref_node_tri_normal(ref_node, nodes, n0), "orig normal");
    RSS(ref_math_normalize(n0), "original triangle has zero area");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) {
        nodes[node] = node0;
      }
    }
    RSS(ref_node_tri_normal(ref_node, nodes, n1), "new normal");
    status = ref_math_normalize(n1);
    if (REF_DIV_ZERO == status) { /* new triangle face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(status, "new normal length")
    dot = ref_math_dot(n0, n1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}